

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_A_ParamSet.c
# Opt level: O3

int point_mul_two_id_GostR3410_2001_CryptoPro_A_ParamSet
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  BIGNUM *pBVar7;
  BIGNUM *pBVar8;
  uint uVar9;
  long lVar10;
  byte bVar11;
  bool bVar12;
  uchar b_y [32];
  uchar b_x [32];
  uchar b_m [32];
  uchar b_n [32];
  pt_aff_t P;
  int8_t bnaf [257];
  int8_t anaf [257];
  pt_prj_t precomp [16];
  undefined1 local_b28 [16];
  undefined1 local_b18 [16];
  undefined1 local_b08 [16];
  undefined1 local_af8 [16];
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [16];
  uint64_t local_ab8;
  BIGNUM *local_ab0;
  uint8_t local_aa8 [32];
  uint8_t local_a88 [32];
  uchar local_a68 [32];
  uchar local_a48 [32];
  pt_aff_t local_a28;
  byte local_9d8 [272];
  byte local_8c8 [272];
  pt_prj_t local_7b8 [16];
  
  local_ab0 = m;
  BN_CTX_start((BN_CTX *)ctx);
  pBVar7 = BN_CTX_get((BN_CTX *)ctx);
  pBVar8 = BN_CTX_get((BN_CTX *)ctx);
  iVar4 = 0;
  iVar6 = 0;
  if (((((pBVar8 != (BIGNUM *)0x0) &&
        (iVar3 = EC_POINT_get_affine_coordinates(group,q,pBVar7,pBVar8,ctx), iVar6 = iVar4,
        iVar3 != 0)) && (iVar4 = BN_bn2lebinpad(pBVar7,local_a88,0x20), iVar4 == 0x20)) &&
      ((iVar4 = BN_bn2lebinpad(pBVar8,local_aa8,0x20), iVar4 == 0x20 &&
       (iVar4 = BN_bn2lebinpad(n,local_a48,0x20), iVar4 == 0x20)))) &&
     (iVar4 = BN_bn2lebinpad(local_ab0,local_a68,0x20), iVar4 == 0x20)) {
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_from_bytes(local_a28.X,local_a88);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_from_bytes(local_a28.Y,local_aa8);
    bVar11 = 0;
    memset(local_8c8,0,0x101);
    memset(local_9d8,0,0x101);
    local_ac8 = (undefined1  [16])0x0;
    local_ad8 = (undefined1  [16])0x0;
    local_ae8 = (undefined1  [16])0x0;
    local_af8 = (undefined1  [16])0x0;
    local_b08 = (undefined1  [16])0x0;
    local_b18 = (undefined1  [16])0x0;
    local_b28 = (undefined1  [16])0x0;
    local_ab8 = 0;
    precomp_wnaf(local_7b8,&local_a28);
    scalar_wnaf((int8_t *)local_8c8,local_a48);
    scalar_wnaf((int8_t *)local_9d8,local_a68);
    bVar2 = true;
    lVar10 = 0x100;
    do {
      if (!bVar2) {
        point_double((pt_prj_t *)local_b28,(pt_prj_t *)local_b28);
      }
      bVar1 = local_9d8[lVar10];
      if (bVar1 != 0) {
        if (bVar11 != bVar1 >> 7) {
          local_b08._8_8_ = 0x1ffffffffffb2e - local_b08._8_8_;
          local_af8._8_8_ = 0xffffffffffffe - local_af8._8_8_;
          local_af8._0_8_ = 0xffffffffffffe - local_af8._0_8_;
          local_ae8._8_8_ = 0xffffffffffffe - local_ae8._8_8_;
          local_ae8._0_8_ = 0xffffffffffffe - local_ae8._0_8_;
          bVar11 = bVar11 ^ 1;
        }
        uVar5 = (int)((int)(char)bVar1 - 1U) >> 1;
        if ((char)bVar1 < '\0') {
          uVar5 = (uint)~(int)(char)bVar1 >> 1;
        }
        if (bVar2) {
          local_b18._8_8_ = local_7b8[(int)uVar5].X[3];
          local_b18._0_8_ = local_7b8[(int)uVar5].X[2];
          local_b28._8_8_ = local_7b8[(int)uVar5].X[1];
          local_b28._0_8_ = local_7b8[(int)uVar5].X[0];
          local_ae8._8_8_ = local_7b8[(int)uVar5].Y[4];
          local_ae8._0_8_ = local_7b8[(int)uVar5].Y[3];
          local_b08._8_8_ = local_7b8[(int)uVar5].Y[0];
          local_b08._0_8_ = local_7b8[(int)uVar5].X[4];
          local_af8._8_8_ = local_7b8[(int)uVar5].Y[2];
          local_af8._0_8_ = local_7b8[(int)uVar5].Y[1];
          local_ab8 = local_7b8[(int)uVar5].Z[4];
          local_ac8._8_8_ = local_7b8[(int)uVar5].Z[3];
          local_ac8._0_8_ = local_7b8[(int)uVar5].Z[2];
          local_ad8._8_8_ = local_7b8[(int)uVar5].Z[1];
          local_ad8._0_8_ = local_7b8[(int)uVar5].Z[0];
        }
        else {
          point_add_proj((pt_prj_t *)local_b28,(pt_prj_t *)local_b28,local_7b8 + (int)uVar5);
        }
        bVar2 = false;
      }
      bVar1 = local_8c8[lVar10];
      uVar5 = (uint)(char)bVar1;
      if (uVar5 != 0) {
        if (bVar11 != bVar1 >> 7) {
          local_b08._8_8_ = 0x1ffffffffffb2e - local_b08._8_8_;
          local_af8._8_8_ = 0xffffffffffffe - local_af8._8_8_;
          local_af8._0_8_ = 0xffffffffffffe - local_af8._0_8_;
          local_ae8._8_8_ = 0xffffffffffffe - local_ae8._8_8_;
          local_ae8._0_8_ = 0xffffffffffffe - local_ae8._0_8_;
          bVar11 = bVar11 ^ 1;
        }
        uVar9 = (int)(uVar5 - 1) >> 1;
        if ((char)bVar1 < '\0') {
          uVar9 = ~uVar5 >> 1;
        }
        if (bVar2) {
          local_b28 = *(undefined1 (*) [16])lut_cmb[0][(int)uVar9].X;
          local_b18 = *(undefined1 (*) [16])(lut_cmb[0][(int)uVar9].X + 2);
          local_b08 = *(undefined1 (*) [16])(lut_cmb[0][(int)uVar9].X + 4);
          local_af8 = *(undefined1 (*) [16])(lut_cmb[0][(int)uVar9].Y + 1);
          local_ae8 = *(undefined1 (*) [16])(lut_cmb[0][(int)uVar9].Y + 3);
          local_ac8 = ZEXT816(0);
          local_ad8 = ZEXT816(1);
          local_ab8 = 0;
        }
        else {
          point_add_mixed((pt_prj_t *)local_b28,(pt_prj_t *)local_b28,lut_cmb[0] + (int)uVar9);
        }
        bVar2 = false;
      }
      bVar12 = lVar10 != 0;
      lVar10 = lVar10 + -1;
    } while (bVar12);
    if (bVar2) {
      local_b18 = (undefined1  [16])0x0;
      local_b28 = (undefined1  [16])0x0;
      local_b08 = ZEXT816(1) << 0x40;
      local_af8 = ZEXT816(0);
      local_ae8 = ZEXT816(0);
      local_ad8 = (undefined1  [16])0x0;
      local_ac8 = (undefined1  [16])0x0;
      local_ab8 = 0;
    }
    if (bVar11 != 0) {
      local_b08._8_8_ = 0x1ffffffffffb2e - local_b08._8_8_;
      local_af8._8_8_ = 0xffffffffffffe - local_af8._8_8_;
      local_af8._0_8_ = 0xffffffffffffe - local_af8._0_8_;
      local_ae8._8_8_ = 0xffffffffffffe - local_ae8._8_8_;
      local_ae8._0_8_ = 0xffffffffffffe - local_ae8._0_8_;
    }
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_inv((uint64_t *)local_ad8,(uint64_t *)local_ad8);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_mul
              (local_a28.X,(uint64_t *)local_b28,(uint64_t *)local_ad8);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_carry_mul
              (local_a28.Y,(uint64_t *)(local_b08 + 8),(uint64_t *)local_ad8);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_to_bytes(local_a88,local_a28.X);
    fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_to_bytes(local_aa8,local_a28.Y);
    iVar6 = CRYPTO_memcmp("",local_a88,0x20);
    if ((iVar6 == 0) && (iVar6 = CRYPTO_memcmp("",local_aa8,0x20), iVar6 == 0)) {
      iVar6 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar6 == 0) {
        iVar6 = 0;
        goto LAB_001256ea;
      }
    }
    else {
      lVar10 = BN_lebin2bn(local_a88,0x20,pBVar7);
      iVar6 = 0;
      if ((lVar10 == 0) ||
         ((lVar10 = BN_lebin2bn(local_aa8,0x20,pBVar8), iVar6 = 0, lVar10 == 0 ||
          (iVar4 = EC_POINT_set_affine_coordinates(group,r,pBVar7,pBVar8,ctx), iVar4 == 0))))
      goto LAB_001256ea;
    }
    iVar6 = 1;
  }
LAB_001256ea:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar6;
}

Assistant:

int
    point_mul_two_id_GostR3410_2001_CryptoPro_A_ParamSet(
        const EC_GROUP *group, EC_POINT *r, const BIGNUM *n, const EC_POINT *q,
        const BIGNUM *m, BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[32];
    unsigned char b_y[32];
    unsigned char b_n[32];
    unsigned char b_m[32];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 32) != 32 || BN_bn2lebinpad(y, b_y, 32) != 32 ||
        BN_bn2lebinpad(n, b_n, 32) != 32 || BN_bn2lebinpad(m, b_m, 32) != 32)
        goto err;
    /* do the simultaneous scalar multiplication */
    point_mul_two(b_x, b_y, b_n, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 32) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 32) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 32, x) == NULL ||
            BN_lebin2bn(b_y, 32, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}